

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

t_int * sigrzero_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  t_int tVar3;
  t_sample coef;
  t_sample next;
  t_sample last;
  int i;
  int n;
  t_sigrzero *x;
  t_sample *out;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  lVar2 = w[4];
  tVar3 = w[5];
  coef = *(t_sample *)(lVar2 + 0x34);
  x = (t_sigrzero *)w[3];
  out = (t_sample *)w[2];
  in2 = (t_sample *)w[1];
  for (next = 0.0; (int)next < (int)tVar3; next = (t_sample)((int)next + 1)) {
    fVar1 = *in2;
    *(float *)&(x->x_obj).te_g.g_pd = -*out * coef + fVar1;
    coef = fVar1;
    x = (t_sigrzero *)((long)&(x->x_obj).te_g.g_pd + 4);
    out = out + 1;
    in2 = in2 + 1;
  }
  *(t_sample *)(lVar2 + 0x34) = coef;
  return w + 6;
}

Assistant:

static t_int *sigrzero_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    t_sigrzero *x = (t_sigrzero *)(w[4]);
    int n = (int)w[5];
    int i;
    t_sample last = x->x_last;
    for (i = 0; i < n; i++)
    {
        t_sample next = *in1++;
        t_sample coef = *in2++;
        *out++ = next - coef * last;
        last = next;
    }
    x->x_last = last;
    return (w+6);
}